

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O1

void __thiscall
GlobOptBlockData::MergeBlockData
          (GlobOptBlockData *this,BasicBlock *toBlock,BasicBlock *fromBlock,
          BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation,
          BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge,bool forceTypeSpecOnLoopHeader)

{
  GlobOptBlockData *fromData;
  StackLiteralInitFldData *value;
  ushort uVar1;
  uint uVar2;
  BVIndex BVar3;
  Type TVar4;
  int iVar5;
  CapturedValues *pCVar6;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount> *pSVar7
  ;
  Loop *pLVar8;
  BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *other;
  StackLiteralInitFldDataMap *this_00;
  Type pSVar9;
  Type pBVar10;
  long lVar11;
  code *pcVar12;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
  *pSVar13;
  bool bVar14;
  int iVar15;
  undefined4 *puVar16;
  Type *pTVar17;
  Type *pTVar18;
  Type *pTVar19;
  Type *pTVar20;
  Value *pVVar21;
  BVSparse<Memory::JitArenaAllocator> *pBVar22;
  StackSym *pSVar23;
  Value *pVVar24;
  CapturedValues *pCVar25;
  StackSym *pSVar26;
  BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  BVSparse<Memory::JitArenaAllocator> *pBVar27;
  long *plVar28;
  ulong uVar29;
  Type pJVar30;
  undefined1 auVar31 [8];
  Type pSVar32;
  CapturedValues *pCVar33;
  Type_conflict pBVar34;
  Type_conflict pBVar35;
  SymID id;
  int iVar36;
  StackLiteralInitFldDataMap *toMap;
  ValueType *this_02;
  bool bVar37;
  undefined1 auStack_c8 [8];
  Iterator iterFrom;
  undefined1 auStack_a8 [8];
  Iterator iterTo;
  undefined1 auStack_88 [8];
  Iterator iterFrom_1;
  undefined1 auStack_68 [8];
  Iterator iterTo_1;
  
  fromData = &fromBlock->globOptData;
  bVar14 = GlobOpt::DoBoundCheckHoist(this->globOpt);
  if (bVar14) {
    GlobOpt::MergeBoundCheckHoistBlockData(this->globOpt,toBlock,this,fromBlock,fromData);
  }
  uVar1 = *(ushort *)&toBlock->field_0x18;
  MergeValueMaps(this,toBlock,fromBlock,symsRequiringCompensation,symsCreatedForMerge);
  GlobOpt::InsertCloneStrs(this->globOpt,toBlock,this,fromData);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            (this->liveFields,(fromBlock->globOptData).liveFields);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            (this->liveArrayValues,(fromBlock->globOptData).liveArrayValues);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            (this->isTempSrc,(fromBlock->globOptData).isTempSrc);
  this->hasCSECandidates =
       (bool)(this->hasCSECandidates & (fromBlock->globOptData).hasCSECandidates);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            (this->changedSyms,(fromBlock->globOptData).changedSyms);
  pCVar33 = this->capturedValues;
  pCVar25 = (fromBlock->globOptData).capturedValues;
  if (pCVar33 == (CapturedValues *)0x0) {
    this->capturedValues = pCVar25;
    pSVar13 = iterTo.list;
    if (pCVar25 != (CapturedValues *)0x0) {
      CapturedValues::IncrementRefCount(pCVar25);
      pSVar13 = iterTo.list;
    }
  }
  else {
    auStack_a8 = (undefined1  [8])pCVar33;
    auStack_c8 = (undefined1  [8])pCVar25;
    iterFrom.list = &pCVar25->constantValues;
    pCVar6 = (CapturedValues *)
             (pCVar33->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next;
    bVar14 = false;
    bVar37 = pCVar6 != pCVar33;
    iterTo.list = &((CapturedValues *)0x0)->constantValues;
    if (bVar37) {
      iterTo.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                     *)pCVar6;
    }
    if (pCVar25 != (CapturedValues *)0x0) {
      if (pCVar25 == (CapturedValues *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar14 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                            ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar14) goto LAB_004989c1;
        *puVar16 = 0;
      }
      pCVar25 = (CapturedValues *)
                ((iterFrom.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      bVar14 = (undefined1  [8])pCVar25 != auStack_c8;
      iterFrom.list = &((CapturedValues *)0x0)->constantValues;
      if (bVar14) {
        iterFrom.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              *)pCVar25;
      }
    }
    if ((bool)(pCVar6 != pCVar33 & bVar14)) {
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        pTVar17 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)auStack_c8);
        pSVar23 = pTVar17->key;
        pTVar17 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)auStack_a8);
        pSVar26 = pTVar17->key;
        uVar2 = (pSVar23->super_Sym).m_id;
        BVar3 = (pSVar26->super_Sym).m_id;
        if (uVar2 < BVar3) {
          BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,uVar2);
          if (iterFrom.list ==
              (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
               *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            bVar14 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar14) goto LAB_004989c1;
            *puVar16 = 0;
          }
          iterFrom.list =
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                *)((iterFrom.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          bVar14 = (undefined1  [8])iterFrom.list != auStack_c8;
          if (!bVar14) {
            iterFrom.list =
                 (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  *)0x0;
          }
        }
        else {
          if (BVar3 < uVar2) {
            BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,BVar3);
          }
          else {
            pTVar17 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                      ::Iterator::Data((Iterator *)auStack_c8);
            pTVar18 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                      ::Iterator::Data((Iterator *)auStack_a8);
            if ((pTVar17->key->super_Sym).m_id != (pTVar18->key->super_Sym).m_id) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar16 = 1;
              bVar14 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                  ,0x1d1,"(symValueFrom->Key()->m_id == symValueTo->Key()->m_id)",
                                  "symValueFrom->Key()->m_id == symValueTo->Key()->m_id");
              if (!bVar14) goto LAB_004989c1;
              *puVar16 = 0;
            }
            iterTo_1.list =
                 *(SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                   **)&(pTVar17->value).u;
            auStack_68[0] = (pTVar17->value).type;
            iterFrom_1.list =
                 *(SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                   **)&(pTVar18->value).u;
            auStack_88[0] = (pTVar18->value).type;
            bVar14 = BailoutConstantValue::IsEqual
                               ((BailoutConstantValue *)auStack_68,
                                (BailoutConstantValue *)auStack_88);
            if (!bVar14) {
              BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,(pSVar26->super_Sym).m_id);
            }
            if (iterFrom.list ==
                (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                 *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar16 = 1;
              bVar14 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar14) goto LAB_004989c1;
              *puVar16 = 0;
            }
            iterFrom.list =
                 (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  *)((iterFrom.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            bVar14 = (undefined1  [8])iterFrom.list != auStack_c8;
            if (!bVar14) {
              iterFrom.list =
                   (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                    *)0x0;
            }
          }
          if (iterTo.list ==
              (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
               *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            bVar37 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar37) goto LAB_004989c1;
            *puVar16 = 0;
          }
          iterTo.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                         *)((iterTo.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          bVar37 = (undefined1  [8])iterTo.list != auStack_a8;
          if (!bVar37) {
            iterTo.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                           *)0x0;
          }
        }
      } while ((bVar14) && (bVar37));
    }
    if ((bVar14) || (bVar37)) {
      plVar28 = (long *)auStack_a8;
      if (bVar14) {
        plVar28 = (long *)auStack_c8;
      }
      auStack_68 = (undefined1  [8])*plVar28;
      iterTo_1.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
            *)plVar28[1];
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        pTVar17 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)auStack_68);
        BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,(pTVar17->key->super_Sym).m_id);
        if (iterTo_1.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar14 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar14) goto LAB_004989c1;
          *puVar16 = 0;
        }
        iterTo_1.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              *)((iterTo_1.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      } while ((undefined1  [8])iterTo_1.list != auStack_68);
    }
    auStack_68 = (undefined1  [8])&this->capturedValues->copyPropSyms;
    pCVar33 = (fromBlock->globOptData).capturedValues;
    auStack_88 = (undefined1  [8])&pCVar33->copyPropSyms;
    if (pCVar33 == (CapturedValues *)0x0) {
      auStack_88 = (undefined1  [8])0x0;
    }
    iterFrom_1.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
          *)auStack_88;
    pSVar7 = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              *)(this->capturedValues->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>.
                next;
    bVar14 = false;
    bVar37 = (undefined1  [8])pSVar7 != auStack_68;
    iterTo_1.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
          *)0x0;
    if (bVar37) {
      iterTo_1.list = pSVar7;
    }
    if (pCVar33 != (CapturedValues *)0x0) {
      pBVar34 = (Type_conflict)
                ((SListNodeBase<Memory::ArenaAllocator> *)&((Type_conflict)auStack_88)->next)->next;
      bVar14 = (undefined1  [8])pBVar34 != auStack_88;
      iterFrom_1.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
            *)(Type_conflict)0x0;
      if (bVar14) {
        iterFrom_1.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              *)pBVar34;
      }
    }
    if ((bool)((undefined1  [8])pSVar7 != auStack_68 & bVar14)) {
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        pTVar19 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)auStack_88);
        pSVar23 = pTVar19->key;
        pTVar19 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)auStack_68);
        pSVar26 = pTVar19->key;
        uVar2 = (pSVar23->super_Sym).m_id;
        BVar3 = (pSVar26->super_Sym).m_id;
        if (uVar2 < BVar3) {
          BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,uVar2);
          if (iterFrom_1.list ==
              (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
               *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            bVar14 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar14) goto LAB_004989c1;
            *puVar16 = 0;
          }
          iterFrom_1.list =
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                *)((iterFrom_1.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          bVar14 = (undefined1  [8])iterFrom_1.list != auStack_88;
          if (!bVar14) {
            iterFrom_1.list =
                 (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  *)0x0;
          }
        }
        else {
          if (BVar3 < uVar2) {
            BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,BVar3);
          }
          else {
            pTVar19 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                      ::Iterator::Data((Iterator *)auStack_88);
            pTVar20 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                      ::Iterator::Data((Iterator *)auStack_68);
            if ((pTVar19->key->super_Sym).m_id != (pTVar20->key->super_Sym).m_id) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar16 = 1;
              bVar14 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                  ,0x1da,
                                  "(copyPropSymFrom->Key()->m_id == copyPropSymTo->Key()->m_id)",
                                  "copyPropSymFrom->Key()->m_id == copyPropSymTo->Key()->m_id");
              if (!bVar14) goto LAB_004989c1;
              *puVar16 = 0;
            }
            if ((pTVar19->value->super_Sym).m_id == (pTVar20->value->super_Sym).m_id) {
              pVVar24 = FindValue(fromData,&pTVar19->key->super_Sym);
              pVVar21 = FindValue(this,&pTVar19->key->super_Sym);
              if ((pVVar21 == (Value *)0x0 || pVVar24 == (Value *)0x0) ||
                 (pVVar24->valueNumber != pVVar21->valueNumber)) goto LAB_00497adc;
            }
            else {
LAB_00497adc:
              BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,(pSVar26->super_Sym).m_id);
            }
            if (iterFrom_1.list ==
                (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                 *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar16 = 1;
              bVar14 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar14) goto LAB_004989c1;
              *puVar16 = 0;
            }
            iterFrom_1.list =
                 (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  *)((iterFrom_1.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            bVar14 = (undefined1  [8])iterFrom_1.list != auStack_88;
            if (!bVar14) {
              iterFrom_1.list =
                   (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                    *)0x0;
            }
          }
          if (iterTo_1.list ==
              (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
               *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            bVar37 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar37) goto LAB_004989c1;
            *puVar16 = 0;
          }
          iterTo_1.list =
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                *)((iterTo_1.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          bVar37 = (undefined1  [8])iterTo_1.list != auStack_68;
          if (!bVar37) {
            iterTo_1.list =
                 (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  *)0x0;
          }
        }
      } while ((bVar14) && (bVar37));
    }
    if ((bVar14) || (pSVar13 = iterTo.list, bVar37)) {
      plVar28 = (long *)auStack_68;
      if (bVar14) {
        plVar28 = (long *)auStack_88;
      }
      auStack_a8 = (undefined1  [8])*plVar28;
      iterTo.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                     *)plVar28[1];
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        pTVar19 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)auStack_a8);
        BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,(pTVar19->key->super_Sym).m_id);
        if (iterTo.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar14 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar14) goto LAB_004989c1;
          *puVar16 = 0;
        }
        iterTo.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                       *)((iterTo.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        pSVar13 = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                   *)0x0;
      } while ((undefined1  [8])iterTo.list != auStack_a8);
    }
  }
  iterTo.list = pSVar13;
  pBVar27 = (fromBlock->globOptData).maybeWrittenTypeSyms;
  if (pBVar27 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    if (this->maybeWrittenTypeSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pBVar22 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,this->globOpt->alloc,0x3f1274);
      pJVar30 = this->globOpt->alloc;
      pBVar22->head = (Type_conflict)0x0;
      pBVar22->lastFoundIndex = (Type_conflict)0x0;
      pBVar22->alloc = pJVar30;
      pBVar22->lastUsedNodePrevNextField = (Type)pBVar22;
      this->maybeWrittenTypeSyms = pBVar22;
      pBVar27 = (fromBlock->globOptData).maybeWrittenTypeSyms;
      BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar27);
      BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
                (pBVar22,pBVar27->head);
    }
    else {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this->maybeWrittenTypeSyms,pBVar27);
    }
  }
  iterFrom_1.current = (NodeBase *)this->globOpt->tempAlloc;
  auStack_68 = (undefined1  [8])0x0;
  iterTo_1.list =
       (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount> *
       )0x0;
  auStack_88 = (undefined1  [8])0x0;
  iterFrom_1.list =
       (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount> *
       )0x0;
  iterTo_1.current = iterFrom_1.current;
  if (forceTypeSpecOnLoopHeader && (uVar1 & 4) != 0) {
    pLVar8 = toBlock->loop;
    BVSparse<Memory::JitArenaAllocator>::Minus
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,
               (fromBlock->globOptData).liveInt32Syms,(fromBlock->globOptData).liveLossyInt32Syms);
    BVSparse<Memory::JitArenaAllocator>::Minus
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_88,this->liveInt32Syms,
               this->liveLossyInt32Syms);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,
               (BVSparse<Memory::JitArenaAllocator> *)auStack_88);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,
               pLVar8->likelyIntSymsUsedBeforeDefined);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,this->liveVarSyms);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              (this->liveInt32Syms,(BVSparse<Memory::JitArenaAllocator> *)auStack_68);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              (this->liveLossyInt32Syms,(BVSparse<Memory::JitArenaAllocator> *)auStack_68);
    bVar14 = GlobOpt::DoLossyIntTypeSpec(this->globOpt);
    if (bVar14) {
      BVSparse<Memory::JitArenaAllocator>::Minus
                ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,
                 (fromBlock->globOptData).liveInt32Syms,this->liveInt32Syms);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
                ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,pLVar8->symsUsedBeforeDefined);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
                ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,this->liveVarSyms);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this->liveInt32Syms,(BVSparse<Memory::JitArenaAllocator> *)auStack_68);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this->liveLossyInt32Syms,(BVSparse<Memory::JitArenaAllocator> *)auStack_68);
    }
    BVSparse<Memory::JitArenaAllocator>::And
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,
               (fromBlock->globOptData).liveFloat64Syms,pLVar8->forceFloat64SymsOnEntry);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              (this->liveFloat64Syms,(BVSparse<Memory::JitArenaAllocator> *)auStack_68);
    BVSparse<Memory::JitArenaAllocator>::Minus
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,
               (fromBlock->globOptData).liveFloat64Syms,this->liveFloat64Syms);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,
               pLVar8->likelyNumberSymsUsedBeforeDefined);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              (this->liveFloat64Syms,(BVSparse<Memory::JitArenaAllocator> *)auStack_68);
  }
  iterTo.current = (NodeBase *)this->globOpt->tempAlloc;
  auStack_a8 = (undefined1  [8])0x0;
  iterTo.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                 *)0x0;
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_88,
             (fromBlock->globOptData).liveInt32Syms,(fromBlock->globOptData).liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,(fromBlock->globOptData).liveVarSyms,
             (BVSparse<Memory::JitArenaAllocator> *)auStack_88);
  BVSparse<Memory::JitArenaAllocator>::Or
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_88,this->liveVarSyms,this->liveInt32Syms
            );
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_88,this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,
             (BVSparse<Memory::JitArenaAllocator> *)auStack_88);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_a8,this->liveInt32Syms,
             this->liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_88,this->liveVarSyms,
             (BVSparse<Memory::JitArenaAllocator> *)auStack_a8);
  BVSparse<Memory::JitArenaAllocator>::Or
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_a8,(fromBlock->globOptData).liveVarSyms,
             (fromBlock->globOptData).liveInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_a8,
             (fromBlock->globOptData).liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_88,
             (BVSparse<Memory::JitArenaAllocator> *)auStack_a8);
  iterFrom.current = (NodeBase *)this->globOpt->tempAlloc;
  auStack_c8 = (undefined1  [8])0x0;
  iterFrom.list =
       (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
        *)0x0;
  BVSparse<Memory::JitArenaAllocator>::And
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_a8,
             (BVSparse<Memory::JitArenaAllocator> *)auStack_68,
             (fromBlock->globOptData).liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::And
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_c8,
             (BVSparse<Memory::JitArenaAllocator> *)auStack_88,this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_a8,
             (BVSparse<Memory::JitArenaAllocator> *)auStack_c8);
  if (auStack_c8 != (undefined1  [8])0x0) {
    auVar31 = auStack_c8;
    pCVar33 = (CapturedValues *)iterFrom.current[0x10].next;
    do {
      pCVar25 = (CapturedValues *)auVar31;
      auVar31 = (undefined1  [8])
                (pCVar25->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next;
      (pCVar25->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pCVar33;
      pCVar33 = pCVar25;
    } while (auVar31 != (undefined1  [8])0x0);
    iterFrom.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
          *)0x0;
    iterFrom.current[0x10].next = (Type)pCVar25;
  }
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,
             (fromBlock->globOptData).liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_88,this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,
             (BVSparse<Memory::JitArenaAllocator> *)auStack_88);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            (this->liveVarSyms,(fromBlock->globOptData).liveVarSyms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            (this->liveVarSyms,(BVSparse<Memory::JitArenaAllocator> *)auStack_68);
  auVar31 = auStack_a8;
  if (auStack_a8 != (undefined1  [8])0x0) {
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      pSVar32 = (((CapturedValues *)auVar31)->copyPropSyms).
                super_SListNodeBase<Memory::ArenaAllocator>.next;
      if (pSVar32 != (Type)0x0) {
        TVar4 = (((CapturedValues *)auVar31)->constantValues).super_RealCount.count;
        uVar29 = 0;
        if (pSVar32 != (Type)0x0) {
          for (; ((ulong)pSVar32 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        do {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar29);
          id = TVar4 + (BVIndex)uVar29;
          pSVar23 = SymTable::FindStackSym(this->globOpt->func->m_symTable,id);
          if (pSVar23 == (StackSym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            bVar14 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                ,0x270,"(stackSym)","stackSym");
            if (!bVar14) goto LAB_004989c1;
            *puVar16 = 0;
          }
          pVVar24 = FindValue(this,&pSVar23->super_Sym);
          if (pVVar24 != (Value *)0x0) {
            this_02 = &pVVar24->valueInfo->super_ValueType;
            bVar14 = ValueType::IsInt(this_02);
            if ((bVar14) ||
               ((bVar14 = ValueType::IsLikelyInt(this_02), bVar14 &&
                (bVar14 = GlobOpt::DoAggressiveIntTypeSpec(this->globOpt), bVar14)))) {
              BVSparse<Memory::JitArenaAllocator>::Set(this->liveVarSyms,id);
            }
          }
          pSVar32 = (Type)((ulong)pSVar32 & ~(1L << (uVar29 & 0x3f)));
          lVar11 = 0;
          if (pSVar32 != (Type)0x0) {
            for (; ((ulong)pSVar32 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
            }
          }
          uVar29 = (ulong)(-(uint)(pSVar32 == (Type)0x0) | (uint)lVar11);
        } while (pSVar32 != (Type)0x0);
      }
      auVar31 = (undefined1  [8])
                (((CapturedValues *)auVar31)->constantValues).
                super_SListNodeBase<Memory::ArenaAllocator>.next;
    } while (auVar31 != (undefined1  [8])0x0);
  }
  if (auStack_a8 != (undefined1  [8])0x0) {
    auVar31 = auStack_a8;
    pCVar33 = (CapturedValues *)iterTo.current[0x10].next;
    do {
      pCVar25 = (CapturedValues *)auVar31;
      auVar31 = (undefined1  [8])
                (pCVar25->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next;
      (pCVar25->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pCVar33;
      pCVar33 = pCVar25;
    } while (auVar31 != (undefined1  [8])0x0);
    iterTo.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                   *)0x0;
    iterTo.current[0x10].next = (Type)pCVar25;
  }
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,this->liveInt32Syms,
             this->liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,
             (fromBlock->globOptData).liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_88,
             (fromBlock->globOptData).liveInt32Syms,(fromBlock->globOptData).liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_88,
             (fromBlock->globOptData).liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_88,this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::Or
            (this->liveFloat64Syms,(BVSparse<Memory::JitArenaAllocator> *)auStack_68,
             (BVSparse<Memory::JitArenaAllocator> *)auStack_88);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            (this->liveInt32Syms,(fromBlock->globOptData).liveInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            (this->liveLossyInt32Syms,(fromBlock->globOptData).liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            (this->liveLossyInt32Syms,this->liveInt32Syms);
  if (auStack_88 != (undefined1  [8])0x0) {
    auVar31 = auStack_88;
    pBVar34 = (Type_conflict)iterFrom_1.current[0x10].next;
    do {
      pBVar35 = (Type_conflict)auVar31;
      auVar31 = (undefined1  [8])((SListNodeBase<Memory::ArenaAllocator> *)&pBVar35->next)->next;
      ((SListNodeBase<Memory::ArenaAllocator> *)&pBVar35->next)->next = (Type)pBVar34;
      pBVar34 = pBVar35;
    } while (auVar31 != (undefined1  [8])0x0);
    iterFrom_1.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
          *)0x0;
    iterFrom_1.current[0x10].next = (Type)pBVar35;
  }
  if (auStack_68 != (undefined1  [8])0x0) {
    auVar31 = auStack_68;
    pSVar23 = (StackSym *)iterTo_1.current[0x10].next;
    do {
      pSVar26 = (StackSym *)auVar31;
      auVar31 = (undefined1  [8])(pSVar26->super_Sym)._vptr_Sym;
      (pSVar26->super_Sym)._vptr_Sym = (_func_int **)pSVar23;
      pSVar23 = pSVar26;
    } while (auVar31 != (undefined1  [8])0x0);
    iterTo_1.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
          *)0x0;
    iterTo_1.current[0x10].next = (Type)pSVar26;
  }
  bVar14 = GlobOpt::TrackArgumentsObject(this->globOpt);
  if ((bVar14) &&
     (bVar14 = BVSparse<Memory::JitArenaAllocator>::Equal
                         (this->argObjSyms,(fromBlock->globOptData).argObjSyms), !bVar14)) {
    GlobOpt::CannotAllocateArgumentsObjectOnStack(this->globOpt,(Func *)0x0);
  }
  pBVar27 = (fromBlock->globOptData).maybeTempObjectSyms;
  pBVar22 = pBVar27;
  if (pBVar27 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
LAB_004983d7:
    pBVar27 = (fromBlock->globOptData).canStoreTempObjectSyms;
    if (pBVar27 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      do {
        pBVar27 = (BVSparse<Memory::JitArenaAllocator> *)pBVar27->head;
        if (pBVar27 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_00498450;
      } while (((Type *)&pBVar27->alloc)->word == 0);
      if (pBVar27 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar14 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                            ,0x2b5,
                            "(!fromData->canStoreTempObjectSyms || fromData->canStoreTempObjectSyms->IsEmpty())"
                            ,
                            "!fromData->canStoreTempObjectSyms || fromData->canStoreTempObjectSyms->IsEmpty()"
                           );
        if (!bVar14) goto LAB_004989c1;
        *puVar16 = 0;
      }
    }
LAB_00498450:
    pBVar27 = this->canStoreTempObjectSyms;
    if (pBVar27 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      if (pBVar27->head != (Type_conflict)0x0) {
        pJVar30 = pBVar27->alloc;
        pBVar10 = pBVar27->head;
        pBVar34 = pJVar30->bvFreeList;
        do {
          pBVar35 = pBVar10;
          pBVar10 = pBVar35->next;
          pBVar35->next = pBVar34;
          pBVar34 = pBVar35;
        } while (pBVar10 != (Type)0x0);
LAB_0049847d:
        pJVar30->bvFreeList = pBVar35;
      }
LAB_00498484:
      pBVar27->head = (Type_conflict)0x0;
      pBVar27->lastFoundIndex = (Type_conflict)0x0;
      pBVar27->lastUsedNodePrevNextField = &pBVar27->head;
    }
  }
  else {
    do {
      pBVar22 = (BVSparse<Memory::JitArenaAllocator> *)pBVar22->head;
      if (pBVar22 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_004983d7;
    } while (((Type *)&pBVar22->alloc)->word == 0);
    if (pBVar22 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_004983d7;
    if (this->maybeTempObjectSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pBVar27 = BVSparse<Memory::JitArenaAllocator>::CopyNew(pBVar27,this->globOpt->alloc);
      this->maybeTempObjectSyms = pBVar27;
    }
    else {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this->maybeTempObjectSyms,pBVar27);
    }
    pBVar27 = (fromBlock->globOptData).canStoreTempObjectSyms;
    pBVar22 = pBVar27;
    if (pBVar27 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
LAB_00498987:
      pBVar27 = this->canStoreTempObjectSyms;
      if (pBVar27 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0049848e;
      if (pBVar27->head != (Type_conflict)0x0) {
        pJVar30 = pBVar27->alloc;
        pBVar10 = pBVar27->head;
        pBVar34 = pJVar30->bvFreeList;
        do {
          pBVar35 = pBVar10;
          pBVar10 = pBVar35->next;
          pBVar35->next = pBVar34;
          pBVar34 = pBVar35;
        } while (pBVar10 != (Type)0x0);
        goto LAB_0049847d;
      }
      goto LAB_00498484;
    }
    do {
      pBVar22 = (BVSparse<Memory::JitArenaAllocator> *)pBVar22->head;
      if (pBVar22 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_00498987;
    } while (((Type *)&pBVar22->alloc)->word == 0);
    if (pBVar22 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_00498987;
    if (this->canStoreTempObjectSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
                (this->canStoreTempObjectSyms,pBVar27);
    }
  }
LAB_0049848e:
  if (this->curFunc != (fromBlock->globOptData).curFunc) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar14 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,700,"(this->curFunc == fromData->curFunc)",
                        "this->curFunc == fromData->curFunc");
    if (!bVar14) goto LAB_004989c1;
    *puVar16 = 0;
  }
  if (((this->callSequence != (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
      ((fromBlock->globOptData).callSequence !=
       (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0)) &&
     (bVar14 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Equals
                         (this->callSequence,(fromBlock->globOptData).callSequence), !bVar14)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar14 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2bd,
                        "((this->callSequence == nullptr && fromData->callSequence == nullptr) || this->callSequence->Equals(*(fromData->callSequence)))"
                        ,
                        "(this->callSequence == nullptr && fromData->callSequence == nullptr) || this->callSequence->Equals(*(fromData->callSequence))"
                       );
    if (!bVar14) goto LAB_004989c1;
    *puVar16 = 0;
  }
  if (this->startCallCount != (fromBlock->globOptData).startCallCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar14 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2be,"(this->startCallCount == fromData->startCallCount)",
                        "this->startCallCount == fromData->startCallCount");
    if (!bVar14) goto LAB_004989c1;
    *puVar16 = 0;
  }
  if (this->argOutCount != (fromBlock->globOptData).argOutCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar14 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2bf,"(this->argOutCount == fromData->argOutCount)",
                        "this->argOutCount == fromData->argOutCount");
    if (!bVar14) goto LAB_004989c1;
    *puVar16 = 0;
  }
  if (this->totalOutParamCount != (fromBlock->globOptData).totalOutParamCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar14 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2c0,"(this->totalOutParamCount == fromData->totalOutParamCount)",
                        "this->totalOutParamCount == fromData->totalOutParamCount");
    if (!bVar14) goto LAB_004989c1;
    *puVar16 = 0;
  }
  if (this->inlinedArgOutSize != (fromBlock->globOptData).inlinedArgOutSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar14 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2c1,"(this->inlinedArgOutSize == fromData->inlinedArgOutSize)",
                        "this->inlinedArgOutSize == fromData->inlinedArgOutSize");
    if (!bVar14) {
LAB_004989c1:
      pcVar12 = (code *)invalidInstructionException();
      (*pcVar12)();
    }
    *puVar16 = 0;
  }
  other = (fromBlock->globOptData).stackLiteralInitFldDataMap;
  if ((other != (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)0x0) &&
     ((this->globOpt->prePassLoop == (Loop *)0x0 ||
      (((toBlock->field_0x18 & 4) != 0 && (toBlock->loop == this->globOpt->rootLoopPrePass)))))) {
    this_00 = this->stackLiteralInitFldDataMap;
    if (this_00 == (StackLiteralInitFldDataMap *)0x0) {
      this_01 = (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::JitArenaAllocator>(0x38,other->alloc,0x3f1274);
      JsUtil::
      BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_01,other);
      this->stackLiteralInitFldDataMap = this_01;
    }
    else if (other->bucketCount != 0) {
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar29 = 0;
      do {
        iVar36 = other->buckets[uVar29];
        while (iVar36 != -1) {
          pSVar9 = other->entries;
          value = (StackLiteralInitFldData *)(pSVar9 + iVar36);
          iVar5 = pSVar9[iVar36].
                  super_DefaultHashedEntry<StackSym_*,_StackLiteralInitFldData,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<StackSym_*,_StackLiteralInitFldData>.
                  super_ValueEntry<StackLiteralInitFldData,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<StackSym_*,_StackLiteralInitFldData>_>
                  .super_KeyValueEntryDataLayout2<StackSym_*,_StackLiteralInitFldData>.next;
          auStack_68 = (undefined1  [8])
                       pSVar9[iVar36].
                       super_DefaultHashedEntry<StackSym_*,_StackLiteralInitFldData,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .super_KeyValueEntry<StackSym_*,_StackLiteralInitFldData>.
                       super_ValueEntry<StackLiteralInitFldData,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<StackSym_*,_StackLiteralInitFldData>_>
                       .super_KeyValueEntryDataLayout2<StackSym_*,_StackLiteralInitFldData>.key;
          iVar15 = JsUtil::
                   BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                   ::
                   Insert<(JsUtil::BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                             ((BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                               *)this_00,(StackSym **)auStack_68,value);
          iVar36 = iVar5;
          if (iVar15 == -1) {
            bVar14 = JsUtil::
                     BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                     ::TryGetReference<StackSym*>
                               ((BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                 *)this_00,(StackSym **)auStack_68,
                                (StackLiteralInitFldData **)auStack_88,(int *)auStack_a8);
            if (!bVar14) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar16 = 1;
              bVar14 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                  ,0x2d6,"(toMap->TryGetReference(stackSym, &currentData))",
                                  "toMap->TryGetReference(stackSym, &currentData)");
              if (!bVar14) goto LAB_004989c1;
              *puVar16 = 0;
            }
            if (((RealCount *)((long)auStack_88 + 8))->count != value->currentInitFldCount) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar16 = 1;
              bVar14 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                  ,0x2d7,
                                  "(currentData->currentInitFldCount == data.currentInitFldCount)",
                                  "currentData->currentInitFldCount == data.currentInitFldCount");
              if (!bVar14) goto LAB_004989c1;
              *puVar16 = 0;
            }
            if ((PropertyIdArray *)((SListNodeBase<Memory::ArenaAllocator> *)auStack_88)->next !=
                value->propIds) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar16 = 1;
              bVar14 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                  ,0x2d8,"(currentData->propIds == data.propIds)",
                                  "currentData->propIds == data.propIds");
              if (!bVar14) goto LAB_004989c1;
              *puVar16 = 0;
            }
          }
        }
        uVar29 = uVar29 + 1;
      } while (uVar29 < other->bucketCount);
    }
  }
  return;
}

Assistant:

void
GlobOptBlockData::MergeBlockData(
    BasicBlock *toBlock,
    BasicBlock *fromBlock,
    BVSparse<JitArenaAllocator> *const symsRequiringCompensation,
    BVSparse<JitArenaAllocator> *const symsCreatedForMerge,
    bool forceTypeSpecOnLoopHeader)
{
    GlobOptBlockData *fromData = &(fromBlock->globOptData);

    if(this->globOpt->DoBoundCheckHoist())
    {
        // Do this before merging values so that it can see whether a sym's value was changed on one side or the other
        this->globOpt->MergeBoundCheckHoistBlockData(toBlock, this, fromBlock, fromData);
    }

    bool isLoopBackEdge = toBlock->isLoopHeader;
    this->MergeValueMaps(toBlock, fromBlock, symsRequiringCompensation, symsCreatedForMerge);

    this->globOpt->InsertCloneStrs(toBlock, this, fromData);

    this->liveFields->And(fromData->liveFields);
    this->liveArrayValues->And(fromData->liveArrayValues);
    this->isTempSrc->And(fromData->isTempSrc);
    this->hasCSECandidates &= fromData->hasCSECandidates;

    this->changedSyms->Or(fromData->changedSyms);
    if (this->capturedValues == nullptr)
    {
        this->capturedValues = fromData->capturedValues;
        if (this->capturedValues)
        {
            this->capturedValues->IncrementRefCount();
        }
    }
    else
    {
        this->MergeCapturedValues(
            &this->capturedValues->constantValues,
            fromData->capturedValues == nullptr ? nullptr : &fromData->capturedValues->constantValues,
            [&](ConstantStackSymValue * symValueFrom, ConstantStackSymValue * symValueTo)
            {
                Assert(symValueFrom->Key()->m_id == symValueTo->Key()->m_id);
                return symValueFrom->Value().IsEqual(symValueTo->Value());
            });

        this->MergeCapturedValues(
            &this->capturedValues->copyPropSyms,
            fromData->capturedValues == nullptr ? nullptr : &fromData->capturedValues->copyPropSyms,
            [&](CopyPropSyms * copyPropSymFrom, CopyPropSyms * copyPropSymTo)
            {
                Assert(copyPropSymFrom->Key()->m_id == copyPropSymTo->Key()->m_id);
                if (copyPropSymFrom->Value()->m_id == copyPropSymTo->Value()->m_id)
                {
                    Value * fromVal = fromData->FindValue(copyPropSymFrom->Key());
                    Value * toVal = this->FindValue(copyPropSymFrom->Key());
                    return fromVal && toVal && fromVal->IsEqualTo(toVal);
                }
                return false;
            });
    }

    if (fromData->maybeWrittenTypeSyms)
    {
        if (this->maybeWrittenTypeSyms == nullptr)
        {
            this->maybeWrittenTypeSyms = JitAnew(this->globOpt->alloc, BVSparse<JitArenaAllocator>, this->globOpt->alloc);
            this->maybeWrittenTypeSyms->Copy(fromData->maybeWrittenTypeSyms);
        }
        else
        {
            this->maybeWrittenTypeSyms->Or(fromData->maybeWrittenTypeSyms);
        }
    }

    {
        // - Keep the var sym live if any of the following is true:
        //     - The var sym is live on both sides
        //     - The var sym is the only live sym that contains the lossless value of the sym on a side (that is, the lossless
        //       int32 sym is not live, and the float64 sym is not live on that side), and the sym of any type is live on the
        //       other side
        //     - On a side, the var and float64 syms are live, the lossless int32 sym is not live, the sym's merged value is
        //       likely int, and the sym of any type is live on the other side. Since the value is likely int, it may be
        //       int-specialized (with lossless conversion) later. Keeping only the float64 sym live requires doing a lossless
        //       conversion from float64 to int32, with bailout if the value of the float is not a true 32-bit integer. Checking
        //       that is costly, and if the float64 sym is converted back to var, it does not become a tagged int, causing a
        //       guaranteed bailout if a lossless conversion to int happens later. Keep the var sym live to preserve its
        //       tagged-ness so that it can be int-specialized while avoiding unnecessary bailouts.
        // - Keep the int32 sym live if it's live on both sides
        //     - Mark the sym as lossy if it's lossy on any side
        // - Keep the float64 sym live if it's live on a side and the sym of a specialized lossless type is live on the other
        //   side
        //
        // fromData.temp =
        //     (fromData.var - (fromData.int32 - fromData.lossyInt32)) &
        //     (this.var | this.int32 | this.float64)
        // this.temp =
        //     (this.var - (this.int32 - this.lossyInt32)) &
        //     (fromData.var | fromData.int32 | fromData.float64)
        // this.var =
        //     (fromData.var & this.var) |
        //     (fromData.temp - fromData.float64) |
        //     (this.temp - this.float64) |
        //     (fromData.temp & fromData.float64 | this.temp & this.float64) & (value ~ int)
        //
        // this.float64 =
        //     fromData.float64 & ((this.int32 - this.lossyInt32) | this.float64) |
        //     this.float64 & ((fromData.int32 - fromData.lossyInt32) | fromData.float64)
        // this.int32 &= fromData.int32
        // this.lossyInt32 = (fromData.lossyInt32 | this.lossyInt32) & this.int32

        BVSparse<JitArenaAllocator> tempBv1(this->globOpt->tempAlloc);
        BVSparse<JitArenaAllocator> tempBv2(this->globOpt->tempAlloc);

        if (isLoopBackEdge && forceTypeSpecOnLoopHeader)
        {
            Loop *const loop = toBlock->loop;

            // Force to lossless int32:
            // forceLosslessInt32 =
            //     ((fromData.int32 - fromData.lossyInt32) - (this.int32 - this.lossyInt32)) &
            //     loop.likelyIntSymsUsedBeforeDefined &
            //     this.var
            tempBv1.Minus(fromData->liveInt32Syms, fromData->liveLossyInt32Syms);
            tempBv2.Minus(this->liveInt32Syms, this->liveLossyInt32Syms);
            tempBv1.Minus(&tempBv2);
            tempBv1.And(loop->likelyIntSymsUsedBeforeDefined);
            tempBv1.And(this->liveVarSyms);
            this->liveInt32Syms->Or(&tempBv1);
            this->liveLossyInt32Syms->Minus(&tempBv1);

            if(this->globOpt->DoLossyIntTypeSpec())
            {
                // Force to lossy int32:
                // forceLossyInt32 = (fromData.int32 - this.int32) & loop.symsUsedBeforeDefined & this.var
                tempBv1.Minus(fromData->liveInt32Syms, this->liveInt32Syms);
                tempBv1.And(loop->symsUsedBeforeDefined);
                tempBv1.And(this->liveVarSyms);
                this->liveInt32Syms->Or(&tempBv1);
                this->liveLossyInt32Syms->Or(&tempBv1);
            }

            // Force to float64:
            // forceFloat64 =
            //     fromData.float64 & loop.forceFloat64 |
            //     (fromData.float64 - this.float64) & loop.likelyNumberSymsUsedBeforeDefined
            tempBv1.And(fromData->liveFloat64Syms, loop->forceFloat64SymsOnEntry);
            this->liveFloat64Syms->Or(&tempBv1);
            tempBv1.Minus(fromData->liveFloat64Syms, this->liveFloat64Syms);
            tempBv1.And(loop->likelyNumberSymsUsedBeforeDefined);
            this->liveFloat64Syms->Or(&tempBv1);
        }

        {
            BVSparse<JitArenaAllocator> tempBv3(this->globOpt->tempAlloc);

            // fromData.temp =
            //     (fromData.var - (fromData.int32 - fromData.lossyInt32)) &
            //     (this.var | this.int32 | this.float64)
            tempBv2.Minus(fromData->liveInt32Syms, fromData->liveLossyInt32Syms);
            tempBv1.Minus(fromData->liveVarSyms, &tempBv2);
            tempBv2.Or(this->liveVarSyms, this->liveInt32Syms);
            tempBv2.Or(this->liveFloat64Syms);
            tempBv1.And(&tempBv2);

            // this.temp =
            //     (this.var - (this.int32 - this.lossyInt32)) &
            //     (fromData.var | fromData.int32 | fromData.float64)
            tempBv3.Minus(this->liveInt32Syms, this->liveLossyInt32Syms);
            tempBv2.Minus(this->liveVarSyms, &tempBv3);
            tempBv3.Or(fromData->liveVarSyms, fromData->liveInt32Syms);
            tempBv3.Or(fromData->liveFloat64Syms);
            tempBv2.And(&tempBv3);

            {
                BVSparse<JitArenaAllocator> tempBv4(this->globOpt->tempAlloc);

                // fromData.temp & fromData.float64 | this.temp & this.float64
                tempBv3.And(&tempBv1, fromData->liveFloat64Syms);
                tempBv4.And(&tempBv2, this->liveFloat64Syms);
                tempBv3.Or(&tempBv4);
            }

            //     (fromData.temp - fromData.float64) |
            //     (this.temp - this.float64)
            tempBv1.Minus(fromData->liveFloat64Syms);
            tempBv2.Minus(this->liveFloat64Syms);
            tempBv1.Or(&tempBv2);

            // this.var =
            //     (fromData.var & this.var) |
            //     (fromData.temp - fromData.float64) |
            //     (this.temp - this.float64)
            this->liveVarSyms->And(fromData->liveVarSyms);
            this->liveVarSyms->Or(&tempBv1);

            // this.var |=
            //     (fromData.temp & fromData.float64 | this.temp & this.float64) & (value ~ int)
            FOREACH_BITSET_IN_SPARSEBV(id, &tempBv3)
            {
                StackSym *const stackSym = this->globOpt->func->m_symTable->FindStackSym(id);
                Assert(stackSym);
                Value *const value = this->FindValue(stackSym);
                if(value)
                {
                    ValueInfo *const valueInfo = value->GetValueInfo();
                    if(valueInfo->IsInt() || (valueInfo->IsLikelyInt() && this->globOpt->DoAggressiveIntTypeSpec()))
                    {
                        this->liveVarSyms->Set(id);
                    }
                }
            } NEXT_BITSET_IN_SPARSEBV;
        }

        //     fromData.float64 & ((this.int32 - this.lossyInt32) | this.float64)
        tempBv1.Minus(this->liveInt32Syms, this->liveLossyInt32Syms);
        tempBv1.Or(this->liveFloat64Syms);
        tempBv1.And(fromData->liveFloat64Syms);

        //     this.float64 & ((fromData.int32 - fromData.lossyInt32) | fromData.float64)
        tempBv2.Minus(fromData->liveInt32Syms, fromData->liveLossyInt32Syms);
        tempBv2.Or(fromData->liveFloat64Syms);
        tempBv2.And(this->liveFloat64Syms);

        // this.float64 =
        //     fromData.float64 & ((this.int32 - this.lossyInt32) | this.float64) |
        //     this.float64 & ((fromData.int32 - fromData.lossyInt32) | fromData.float64)
        this->liveFloat64Syms->Or(&tempBv1, &tempBv2);

        // this.int32 &= fromData.int32
        // this.lossyInt32 = (fromData.lossyInt32 | this.lossyInt32) & this.int32
        this->liveInt32Syms->And(fromData->liveInt32Syms);
        this->liveLossyInt32Syms->Or(fromData->liveLossyInt32Syms);
        this->liveLossyInt32Syms->And(this->liveInt32Syms);
    }

    if (this->globOpt->TrackArgumentsObject())
    {
        if (!this->argObjSyms->Equal(fromData->argObjSyms))
        {
            this->globOpt->CannotAllocateArgumentsObjectOnStack(nullptr);
        }
    }

    if (fromData->maybeTempObjectSyms && !fromData->maybeTempObjectSyms->IsEmpty())
    {
        if (this->maybeTempObjectSyms)
        {
            this->maybeTempObjectSyms->Or(fromData->maybeTempObjectSyms);
        }
        else
        {
            this->maybeTempObjectSyms = fromData->maybeTempObjectSyms->CopyNew(this->globOpt->alloc);
        }

        if (fromData->canStoreTempObjectSyms && !fromData->canStoreTempObjectSyms->IsEmpty())
        {
            if (this->canStoreTempObjectSyms)
            {
                // Both need to be temp object
                this->canStoreTempObjectSyms->And(fromData->canStoreTempObjectSyms);
            }
        }
        else if (this->canStoreTempObjectSyms)
        {
            this->canStoreTempObjectSyms->ClearAll();
        }
    }
    else
    {
        Assert(!fromData->canStoreTempObjectSyms || fromData->canStoreTempObjectSyms->IsEmpty());
        if (this->canStoreTempObjectSyms)
        {
            this->canStoreTempObjectSyms->ClearAll();
        }
    }

    Assert(this->curFunc == fromData->curFunc);
    Assert((this->callSequence == nullptr && fromData->callSequence == nullptr) || this->callSequence->Equals(*(fromData->callSequence)));
    Assert(this->startCallCount == fromData->startCallCount);
    Assert(this->argOutCount == fromData->argOutCount);
    Assert(this->totalOutParamCount == fromData->totalOutParamCount);
    Assert(this->inlinedArgOutSize == fromData->inlinedArgOutSize);

    // stackLiteralInitFldDataMap is a union of the stack literal from two path.
    // Although we don't need the data on loop prepass, we need to do it for the loop header
    // because we capture the loop header bailout on loop prepass.
    if (fromData->stackLiteralInitFldDataMap != nullptr &&
        (!this->globOpt->IsLoopPrePass() || (toBlock->isLoopHeader && toBlock->loop == this->globOpt->rootLoopPrePass)))
    {
        if (this->stackLiteralInitFldDataMap == nullptr)
        {
            this->stackLiteralInitFldDataMap = fromData->stackLiteralInitFldDataMap->Clone();
        }
        else
        {
            StackLiteralInitFldDataMap * toMap = this->stackLiteralInitFldDataMap;
            fromData->stackLiteralInitFldDataMap->Map([toMap](StackSym * stackSym, StackLiteralInitFldData const& data)
            {
                if (toMap->AddNew(stackSym, data) == -1)
                {
                    // If there is an existing data for the stackSym, both path should match
                    DebugOnly(StackLiteralInitFldData const * currentData);
                    Assert(toMap->TryGetReference(stackSym, &currentData));
                    Assert(currentData->currentInitFldCount == data.currentInitFldCount);
                    Assert(currentData->propIds == data.propIds);
                }
            });
        }
    }
}